

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.c
# Opt level: O3

int ndn_forwarder_remove_all_routes(uint8_t *prefix,size_t length)

{
  int iVar1;
  ndn_fib_entry_t *entry;
  
  iVar1 = tlv_check_type_length(prefix,length,7);
  if (iVar1 == 0) {
    entry = ndn_fib_find(forwarder.fib,prefix,length);
    if (entry == (ndn_fib_entry_t *)0x0) {
      iVar1 = -0x32;
    }
    else {
      entry->nexthop = 0;
      ndn_fib_remove_entry_if_empty(forwarder.fib,entry);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
ndn_forwarder_remove_all_routes(uint8_t* prefix, size_t length)
{
  int ret = tlv_check_type_length(prefix, length, TLV_Name);
  if(ret != NDN_SUCCESS)
    return ret;

  ndn_fib_entry_t* fib_entry = ndn_fib_find(forwarder.fib, prefix, length);
  if (fib_entry == NULL)
    return NDN_FWD_NO_EFFECT;
  fib_entry->nexthop = 0;
  ndn_fib_remove_entry_if_empty(forwarder.fib, fib_entry);
  return NDN_SUCCESS;
}